

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O0

ssize_t zt_cstr_upto(char *s,ssize_t i,ssize_t j,char *set)

{
  size_t i_00;
  ssize_t sVar1;
  char *pcVar2;
  char *in_RCX;
  char *in_RDI;
  ssize_t t;
  size_t len;
  size_t in_stack_ffffffffffffffc8;
  long local_20;
  long local_18;
  
  i_00 = strlen(in_RDI);
  if (i_00 == 0) {
    local_18 = 0;
    local_20 = 0;
  }
  else {
    sVar1 = IDX(i_00,in_stack_ffffffffffffffc8);
    local_20 = IDX(i_00,in_stack_ffffffffffffffc8);
    local_18 = sVar1;
    if (local_20 < sVar1) {
      local_18 = local_20;
      local_20 = sVar1;
    }
  }
  while( true ) {
    if (local_20 < local_18) {
      return -1;
    }
    pcVar2 = strchr(in_RCX,(int)in_RDI[local_18]);
    if (pcVar2 != (char *)0x0) break;
    local_18 = local_18 + 1;
  }
  return local_18;
}

Assistant:

ssize_t
zt_cstr_upto(const char *s, ssize_t i, ssize_t j, const char *set) {
    zt_assert(set);

    CONVERT(s, i, j);

    for (; i <= j; i++) {
        if (strchr(set, s[i])) {
            return i;
        }
    }

    return -1;
}